

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int idaLsPerf(IDAMem IDA_mem,int perftask)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  pvVar1 = IDA_mem->ida_lmem;
  if (pvVar1 == (void *)0x0) {
    iVar4 = -2;
    IDAProcessError(IDA_mem,-2,0x691,"idaLsPerf",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Linear solver memory is NULL.");
  }
  else if (perftask == 0) {
    *(long *)((long)pvVar1 + 0xc0) = IDA_mem->ida_nst;
    *(long *)((long)pvVar1 + 200) = IDA_mem->ida_nni;
    *(long *)((long)pvVar1 + 0xd0) = IDA_mem->ida_ncfn;
    *(undefined8 *)((long)pvVar1 + 0xd8) = *(undefined8 *)((long)pvVar1 + 0xa0);
    *(undefined8 *)((long)pvVar1 + 0xe0) = 0;
    iVar4 = 0;
  }
  else {
    lVar2 = IDA_mem->ida_nst - *(long *)((long)pvVar1 + 0xc0);
    lVar3 = IDA_mem->ida_nni - *(long *)((long)pvVar1 + 200);
    iVar4 = 0;
    if (lVar3 != 0 && lVar2 != 0) {
      dVar5 = (double)(IDA_mem->ida_ncfn - *(long *)((long)pvVar1 + 0xd0)) / (double)lVar2;
      dVar6 = (double)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0xd8)) /
              (double)lVar3;
      if ((0.9 < dVar5) || (0.9 < dVar6)) {
        lVar2 = *(long *)((long)pvVar1 + 0xe0);
        *(long *)((long)pvVar1 + 0xe0) = lVar2 + 1;
        if (lVar2 < 10) {
          if (0.9 < dVar5) {
            IDAProcessError(IDA_mem,99,0x6b8,"idaLsPerf",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                            ,
                            "Warning: at t = %.15g, poor iterative algorithm performance. Nonlinear convergence failure rate is %.15g."
                            ,IDA_mem->ida_tn);
          }
          iVar4 = 0;
          if (0.9 < dVar6) {
            IDAProcessError(IDA_mem,99,0x6bd,"idaLsPerf",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                            ,
                            "Warning: at t = %.15g, poor iterative algorithm performance. Linear convergence failure rate is %.15g."
                            ,IDA_mem->ida_tn,dVar6);
          }
        }
        else {
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int idaLsPerf(IDAMem IDA_mem, int perftask)
{
  IDALsMem idals_mem;
  sunrealtype rcfn, rcfl;
  long int nstd, nnid;
  sunbooleantype lcfn, lcfl;

  /* access IDALsMem structure */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* when perftask == 0, store current performance statistics */
  if (perftask == 0)
  {
    idals_mem->nst0  = IDA_mem->ida_nst;
    idals_mem->nni0  = IDA_mem->ida_nni;
    idals_mem->ncfn0 = IDA_mem->ida_ncfn;
    idals_mem->ncfl0 = idals_mem->ncfl;
    idals_mem->nwarn = 0;
    return (0);
  }

  /* Compute statistics since last call

     Note: the performance monitor that checked whether the average
       number of linear iterations was too close to maxl has been
       removed, since the 'maxl' value is no longer owned by the
       IDALs interface.
   */
  nstd = IDA_mem->ida_nst - idals_mem->nst0;
  nnid = IDA_mem->ida_nni - idals_mem->nni0;
  if (nstd == 0 || nnid == 0) { return (0); }

  rcfn = ((sunrealtype)(IDA_mem->ida_ncfn - idals_mem->ncfn0)) /
         ((sunrealtype)nstd);
  rcfl = ((sunrealtype)(idals_mem->ncfl - idals_mem->ncfl0)) /
         ((sunrealtype)nnid);
  lcfn = (rcfn > PT9);
  lcfl = (rcfl > PT9);
  if (!(lcfn || lcfl)) { return (0); }
  idals_mem->nwarn++;
  if (idals_mem->nwarn > 10) { return (1); }
  if (lcfn)
  {
    IDAProcessError(IDA_mem, IDA_WARNING, __LINE__, __func__, __FILE__,
                    MSG_LS_CFN_WARN, IDA_mem->ida_tn, rcfn);
  }
  if (lcfl)
  {
    IDAProcessError(IDA_mem, IDA_WARNING, __LINE__, __func__, __FILE__,
                    MSG_LS_CFL_WARN, IDA_mem->ida_tn, rcfl);
  }
  return (0);
}